

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PP_COORD.cpp
# Opt level: O2

void __thiscall PP_COORD::show(PP_COORD *this)

{
  ostream *poVar1;
  
  std::operator<<((ostream *)&std::cout,"(x,y,z)=(");
  poVar1 = std::ostream::_M_insert<double>(this->x);
  std::operator<<(poVar1,",");
  poVar1 = std::ostream::_M_insert<double>(this->y);
  std::operator<<(poVar1,",");
  poVar1 = std::ostream::_M_insert<double>(this->z);
  poVar1 = std::operator<<(poVar1,")");
  std::endl<char,std::char_traits<char>>(poVar1);
  return;
}

Assistant:

void PP_COORD::show(void)
{
    std::cout << "(x,y,z)=(" << x << "," << y << "," << z << ")" << std::endl;
}